

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  ushort c_00;
  ImVec2 IVar1;
  ImVec2 local_70;
  float local_68;
  uint local_64;
  float char_width;
  uint c;
  ImWchar *s;
  float local_50;
  float line_width;
  float scale;
  float line_height;
  ImFont *font;
  ImGuiContext *g;
  ImVec2 *pIStack_30;
  bool stop_on_new_line_local;
  ImVec2 *out_offset_local;
  ImWchar **remaining_local;
  ImWchar *text_end_local;
  ImWchar *text_begin_local;
  ImVec2 text_size;
  
  font = (ImFont *)GImGui;
  _scale = GImGui->Font;
  line_width = GImGui->FontSize;
  local_50 = line_width / _scale->FontSize;
  g._7_1_ = stop_on_new_line;
  pIStack_30 = out_offset;
  out_offset_local = (ImVec2 *)remaining;
  remaining_local = (ImWchar **)text_end;
  text_end_local = text_begin;
  ImVec2::ImVec2((ImVec2 *)&text_begin_local,0.0,0.0);
  s._4_4_ = 0.0;
  _char_width = (ImVec2)text_end_local;
  do {
    while( true ) {
      if (remaining_local <= (ulong)_char_width) goto LAB_0015f123;
      IVar1 = (ImVec2)((long)_char_width + 2);
      c_00 = *(ushort *)_char_width;
      local_64 = (uint)c_00;
      _char_width = IVar1;
      if (local_64 == 10) break;
      if (local_64 != 0xd) {
        local_68 = ImFont::GetCharAdvance(_scale,c_00);
        local_68 = local_68 * local_50;
        s._4_4_ = local_68 + s._4_4_;
      }
    }
    text_begin_local._0_4_ = ImMax<float>(text_begin_local._0_4_,s._4_4_);
    text_begin_local._4_4_ = line_width + text_begin_local._4_4_;
    s._4_4_ = 0.0;
  } while ((g._7_1_ & 1) == 0);
LAB_0015f123:
  if (text_begin_local._0_4_ < s._4_4_) {
    text_begin_local._0_4_ = s._4_4_;
  }
  if (pIStack_30 != (ImVec2 *)0x0) {
    ImVec2::ImVec2(&local_70,s._4_4_,text_begin_local._4_4_ + line_width);
    *pIStack_30 = local_70;
  }
  if ((0.0 < s._4_4_) || ((text_begin_local._4_4_ == 0.0 && (!NAN(text_begin_local._4_4_))))) {
    text_begin_local._4_4_ = line_width + text_begin_local._4_4_;
  }
  if (out_offset_local != (ImVec2 *)0x0) {
    *out_offset_local = _char_width;
  }
  IVar1.y = text_begin_local._4_4_;
  IVar1.x = text_begin_local._0_4_;
  return IVar1;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}